

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::TriangleDraw::Cleanup(TriangleDraw *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  
  this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8ca8,0);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  pRVar1 = (this->super_GatherBase).super_TGBase.renderTarget;
  glu::CallLogWrapper::glViewport(this_00,0,0,pRVar1->m_width,pRVar1->m_height);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&(this->super_GatherBase).tex);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&this->fbo);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&this->rbo);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->vbo);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->program);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
		glDisableVertexAttribArray(0);
		glViewport(0, 0, GetWindowWidth(), GetWindowHeight());
		glDeleteTextures(1, &tex);
		glDeleteFramebuffers(1, &fbo);
		glDeleteRenderbuffers(1, &rbo);
		glDeleteVertexArrays(1, &vao);
		glDeleteBuffers(1, &vbo);
		glDeleteProgram(program);
		return NO_ERROR;
	}